

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<capnp::compiler::CapnpParser::DeclParserResult>::Maybe
          (Maybe<capnp::compiler::CapnpParser::DeclParserResult> *this,
          Maybe<capnp::compiler::CapnpParser::DeclParserResult> *other)

{
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::NullableValue
            (&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }